

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_request::clear(coro_http_request *this)

{
  bool bVar1;
  any *in_RDI;
  _func_void__Op_any_ptr__Arg_ptr *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffff0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
  in_RDI[6]._M_manager = local_18;
  in_RDI[6]._M_storage._M_ptr = in_stack_fffffffffffffff0;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_fffffffffffffff0);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x3a4cc5);
  }
  bVar1 = std::any::has_value((any *)&in_RDI[0xb]._M_storage);
  if (bVar1) {
    std::any::reset(in_RDI);
  }
  return;
}

Assistant:

void clear() {
    body_ = {};
    if (!aspect_data_.empty()) {
      aspect_data_.clear();
    }
    if (user_data_.has_value()) {
      user_data_.reset();
    }
  }